

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O2

bool getBool(Object *object)

{
  uint uVar1;
  long lVar2;
  runtime_error *this;
  undefined1 uVar3;
  
  do {
    if (object == (Object *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"ScriptUtils::getBool => object is null!");
LAB_0010540e:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = (**object->_vptr_Object)(object);
    if ((char)uVar1 != '\x02') {
      if ((uVar1 & 0xff) == 0) {
        lVar2 = __dynamic_cast(object,&Object::typeinfo,&ObjectInt::typeinfo,0);
        uVar3 = *(int *)(lVar2 + 8) == 1;
      }
      else {
        if ((uVar1 & 0xff) != 1) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"ScriptUtils::getBool => wrong type!");
          goto LAB_0010540e;
        }
        lVar2 = __dynamic_cast(object,&Object::typeinfo,&ObjectBool::typeinfo,0);
        uVar3 = *(undefined1 *)(lVar2 + 8);
      }
      return (bool)uVar3;
    }
    lVar2 = __dynamic_cast(object,&Object::typeinfo,&Variable::typeinfo,0);
    object = *(Object **)(lVar2 + 8);
  } while( true );
}

Assistant:

bool getBool(Object* object) {
	if (object == nullptr) {
		throw std::runtime_error("ScriptUtils::getBool => object is null!");
	}
	ObjectType type = object->getType();
	if (type == OT_BOOL) {
		auto* objectBool = dynamic_cast<ObjectBool*>(object);
		return objectBool->value;
	} else if (type == OT_INT) {
		auto *objectInt = dynamic_cast<ObjectInt *>(object);
		return objectInt->value == 1;
	} else if (type == OT_VARIABLE) {
		auto *objectVariable = dynamic_cast<Variable *>(object);
		return getBool(objectVariable->value);
	} else {
		throw std::runtime_error("ScriptUtils::getBool => wrong type!");
	}
}